

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::PropertyInstance::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Property *prop,PropertyInstance *p_pcOut,bool p_bBE)

{
  pointer *ppVVar1;
  EDataType EVar2;
  iterator __position;
  ValueUnion VVar3;
  long lVar4;
  ValueUnion v;
  ValueUnion local_40;
  ulong local_38;
  
  if (prop == (Property *)0x0) {
    __assert_fail("__null != prop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x373,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
                 );
  }
  if (p_pcOut != (PropertyInstance *)0x0) {
    if (prop->bIsList == true) {
      ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eFirstType,&local_40,p_bBE);
      EVar2 = prop->eFirstType;
      VVar3 = local_40;
      if (EDT_UInt < EVar2) {
        if (EVar2 == EDT_Float) {
          VVar3 = (ValueUnion)(long)local_40.fFloat;
        }
        else {
          if (EVar2 != EDT_Double) {
            std::
            vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
            ::resize(&p_pcOut->avList,0);
            return true;
          }
          VVar3 = (ValueUnion)(long)local_40.fDouble;
        }
      }
      local_38 = (ulong)VVar3 & 0xffffffff;
      std::
      vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ::resize(&p_pcOut->avList,local_38);
      if (VVar3.iUInt != 0) {
        local_38 = local_38 << 3;
        lVar4 = 0;
        do {
          ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eType,
                           (ValueUnion *)
                           ((long)(p_pcOut->avList).
                                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar4),p_bBE);
          lVar4 = lVar4 + 8;
        } while (local_38 != lVar4);
      }
    }
    else {
      ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eType,&local_40,p_bBE);
      __position._M_current =
           (p_pcOut->avList).
           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (p_pcOut->avList).
          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
        ::_M_realloc_insert<Assimp::PLY::PropertyInstance::ValueUnion_const&>
                  ((vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
                    *)p_pcOut,__position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        ppVVar1 = &(p_pcOut->avList).
                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
    }
    return true;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x374,
                "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
               );
}

Assistant:

bool PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Property* prop,
  PLY::PropertyInstance* p_pcOut,
  bool p_bBE)
{
  ai_assert(NULL != prop);
  ai_assert(NULL != p_pcOut);

  // parse all elements
  if (prop->bIsList)
  {
    // parse the number of elements in the list
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eFirstType, &v, p_bBE);

    // convert to unsigned int
    unsigned int iNum = PLY::PropertyInstance::ConvertTo<unsigned int>(v, prop->eFirstType);

    // parse all list elements
    p_pcOut->avList.resize(iNum);
    for (unsigned int i = 0; i < iNum; ++i)
    {
      PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &p_pcOut->avList[i], p_bBE);
    }
  }
  else
  {
    // parse the property
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &v, p_bBE);
    p_pcOut->avList.push_back(v);
  }
  return true;
}